

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric_manager.hpp
# Opt level: O0

Lazy<void> __thiscall
ylt::metric::dynamic_metric_manager<test_id_t<1UL>_>::check_label_expired
          (dynamic_metric_manager<test_id_t<1UL>_> *this,weak_ptr<coro_io::period_timer> *weak)

{
  bool bVar1;
  undefined8 *puVar2;
  LazyPromise<void> *this_00;
  undefined8 *extraout_RAX;
  undefined8 *extraout_RAX_00;
  undefined8 in_RSI;
  LazyBase<void,_false> in_RDI;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe44;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  int in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  undefined4 in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe6c;
  int in_stack_fffffffffffffe70;
  int iVar3;
  int in_stack_fffffffffffffe74;
  int local_164;
  period_timer *in_stack_ffffffffffffff88;
  
  puVar2 = (undefined8 *)operator_new(0x90,(nothrow_t *)&std::nothrow);
  if (puVar2 == (undefined8 *)0x0) {
    async_simple::coro::detail::LazyPromise<void>::get_return_object_on_allocation_failure();
  }
  else {
    *puVar2 = check_label_expired;
    puVar2[1] = check_label_expired;
    this_00 = (LazyPromise<void> *)(puVar2 + 2);
    puVar2[0xf] = in_RSI;
    std::weak_ptr<coro_io::period_timer>::weak_ptr
              ((weak_ptr<coro_io::period_timer> *)
               CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
               (weak_ptr<coro_io::period_timer> *)
               CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    async_simple::coro::detail::LazyPromise<void>::LazyPromise
              ((LazyPromise<void> *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
    async_simple::coro::detail::LazyPromise<void>::get_return_object
              ((LazyPromise<void> *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    async_simple::coro::detail::LazyPromiseBase::initial_suspend((LazyPromiseBase *)this_00);
    bVar1 = std::suspend_always::await_ready((suspend_always *)((long)puVar2 + 0x85));
    if (bVar1) {
      std::suspend_always::await_resume((suspend_always *)((long)puVar2 + 0x85));
      while( true ) {
        std::weak_ptr<coro_io::period_timer>::lock
                  ((weak_ptr<coro_io::period_timer> *)
                   CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
        bVar1 = std::operator==((shared_ptr<coro_io::period_timer> *)
                                CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                (nullptr_t)
                                CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
        if (bVar1) {
          async_simple::coro::detail::LazyPromise<void>::return_void(this_00);
          local_164 = 3;
          iVar3 = in_stack_fffffffffffffe60;
        }
        else {
          std::__shared_ptr_access<coro_io::period_timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<coro_io::period_timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x24362f);
          std::chrono::duration<long,std::ratio<1l,1000000000l>>::
          duration<long,std::ratio<1l,1l>,void>
                    (in_stack_fffffffffffffe50,
                     (duration<long,_std::ratio<1L,_1L>_> *)
                     CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
          asio::
          basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
          ::expires_after((basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
                           *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                          (duration *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58))
          ;
          std::__shared_ptr_access<coro_io::period_timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<coro_io::period_timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x24366b);
          coro_io::period_timer::async_await(in_stack_ffffffffffffff88);
          async_simple::coro::detail::LazyPromiseBase::
          await_transform<async_simple::coro::Lazy<bool>>
                    ((LazyPromiseBase *)
                     CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                     (Lazy<bool> *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
          bVar1 = async_simple::coro::detail::LazyAwaiterBase<bool>::await_ready
                            ((LazyAwaiterBase<bool> *)(puVar2 + 0xd));
          if (!bVar1) {
            *(undefined1 *)((long)puVar2 + 0x84) = 1;
            metric::dynamic_metric_manager
                      ((void *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                       (void *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
            (*(code *)*extraout_RAX)(extraout_RAX);
            return (Lazy<void>)in_RDI._coro.__handle_.__handle_;
          }
          puVar2[10] = (LazyAwaiterBase<bool> *)(puVar2 + 0xd);
          bVar1 = async_simple::coro::detail::LazyAwaiterBase<bool>::awaitResume
                            ((LazyAwaiterBase<bool> *)
                             CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
          *(byte *)((long)puVar2 + 0x87) = bVar1;
          iVar3 = 0;
          async_simple::coro::detail::LazyBase<bool,_false>::ValueAwaiter::~ValueAwaiter
                    ((ValueAwaiter *)0x2437dc);
          async_simple::coro::Lazy<bool>::~Lazy((Lazy<bool> *)0x2437e9);
          in_stack_fffffffffffffe6c = iVar3;
          in_stack_fffffffffffffe70 = iVar3;
          in_stack_fffffffffffffe74 = iVar3;
          local_164 = iVar3;
          if (iVar3 == 0) {
            *(byte *)((long)puVar2 + 0x86) = *(byte *)((long)puVar2 + 0x87) & 1;
            if ((*(byte *)((long)puVar2 + 0x86) & 1) == 0) {
              async_simple::coro::detail::LazyPromise<void>::return_void(this_00);
              in_stack_fffffffffffffe68 = 3;
              iVar3 = 3;
              in_stack_fffffffffffffe6c = iVar3;
              local_164 = iVar3;
            }
            else {
              util::
              map_sharded_t<std::unordered_map<std::__cxx11::string,std::shared_ptr<ylt::metric::dynamic_metric>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<ylt::metric::dynamic_metric>>>>,ylt::metric::dynamic_metric_manager<test_id_t<1ul>>::my_hash<131ul>>
              ::
              for_each<ylt::metric::dynamic_metric_manager<test_id_t<1ul>>::check_label_expired(std::weak_ptr<coro_io::period_timer>)::_lambda(auto:1&)_1_>
                        ((map_sharded_t<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ylt::metric::dynamic_metric>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ylt::metric::dynamic_metric>_>_>_>,_ylt::metric::dynamic_metric_manager<test_id_t<1UL>_>::my_hash<131UL>_>
                          *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                         (anon_class_1_0_00000001 *)
                         CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
              in_stack_fffffffffffffe64 = 0;
              iVar3 = 0;
              in_stack_fffffffffffffe6c = iVar3;
              local_164 = iVar3;
            }
          }
        }
        std::shared_ptr<coro_io::period_timer>::~shared_ptr
                  ((shared_ptr<coro_io::period_timer> *)0x24389e);
        if (local_164 != 0) break;
        in_stack_fffffffffffffe5c = 0;
        in_stack_fffffffffffffe60 = iVar3;
      }
      if (local_164 == 3) {
        async_simple::coro::detail::LazyPromiseBase::final_suspend((LazyPromiseBase *)this_00);
        bVar1 = async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_ready
                          ((FinalAwaiter *)((long)puVar2 + 0x89));
        if (!bVar1) {
          *puVar2 = 0;
          *(undefined1 *)((long)puVar2 + 0x84) = 2;
          metric::dynamic_metric_manager
                    (in_stack_fffffffffffffe50,
                     (void *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
          (*(code *)*extraout_RAX_00)(extraout_RAX_00);
          return (Lazy<void>)in_RDI._coro.__handle_.__handle_;
        }
        async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_resume
                  ((FinalAwaiter *)((long)puVar2 + 0x89));
      }
      async_simple::coro::detail::LazyPromise<void>::~LazyPromise((LazyPromise<void> *)0x243a3e);
      std::weak_ptr<coro_io::period_timer>::~weak_ptr((weak_ptr<coro_io::period_timer> *)0x243a4b);
      if (puVar2 != (undefined8 *)0x0) {
        operator_delete(puVar2,0x90);
      }
    }
    else {
      *(undefined1 *)((long)puVar2 + 0x84) = 0;
      metric::dynamic_metric_manager
                (in_stack_fffffffffffffe50,
                 (void *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    }
  }
  return (Lazy<void>)in_RDI._coro.__handle_;
}

Assistant:

async_simple::coro::Lazy<void> check_label_expired(
      std::weak_ptr<coro_io::period_timer> weak) {
    while (true) {
      auto timer = weak.lock();
      if (timer == nullptr) {
        co_return;
      }
      timer->expires_after(ylt_label_check_expire_duration);
      bool r = co_await timer->async_await();
      if (!r) {
        co_return;
      }
      metric_map_.for_each([](auto& metric) {
        metric.second->clean_expired_label();
      });
    }
  }